

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O2

void process_extra(char *p,size_t extra_length,zip_entry *zip_entry)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  short sVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  
  uVar6 = 0;
  do {
    if (extra_length - 4 <= uVar6) {
      return;
    }
    uVar3 = *(ushort *)(p + uVar6 + 2);
    uVar8 = (uint)uVar3;
    iVar5 = (int)uVar6;
    if (extra_length < iVar5 + (uint)uVar3 + 4) {
      return;
    }
    uVar7 = iVar5 + 4;
    sVar4 = *(short *)(p + uVar6);
    uVar6 = (ulong)uVar7;
    if (sVar4 == 0x7875) {
      if (uVar3 == 0) {
LAB_0015e156:
        uVar8 = 0;
      }
      else if (p[uVar6] == '\x01') {
        iVar9 = 0;
        if (3 < uVar3) {
          iVar9 = (int)p[iVar5 + 5];
          if (iVar9 == 2) {
            uVar10 = (ulong)*(ushort *)(p + uVar6 + 2);
            iVar9 = 2;
          }
          else {
            if ((uVar3 < 6) || (p[iVar5 + 5] != '\x04')) goto LAB_0015e232;
            uVar10 = (ulong)*(uint *)(p + uVar6 + 2);
            iVar9 = 4;
          }
          zip_entry->uid = uVar10;
        }
LAB_0015e232:
        if (iVar9 + 5 <= (int)(uint)uVar3) {
          if (p[iVar5 + iVar9 + 6] == '\x04') {
            if (iVar9 + 7 <= (int)(uint)uVar3) {
              uVar6 = (ulong)*(uint *)(p + (long)iVar9 + uVar6 + 3);
              goto LAB_0015e058;
            }
          }
          else if (p[iVar5 + iVar9 + 6] == '\x02') {
            uVar6 = (ulong)*(ushort *)(p + (long)iVar9 + uVar6 + 3);
LAB_0015e058:
            zip_entry->gid = uVar6;
          }
        }
      }
    }
    else if (sVar4 == 0x5455) {
      bVar1 = p[uVar6];
      uVar7 = iVar5 + 5;
      uVar8 = uVar8 - 1;
      if ((bVar1 & 1) != 0) {
        if ((ushort)uVar8 < 4) goto LAB_0015e159;
        zip_entry->mtime = (ulong)*(uint *)(p + uVar7);
        uVar7 = iVar5 + 9;
        uVar8 = uVar3 - 5;
      }
      if ((bVar1 & 2) != 0) {
        if ((ushort)uVar8 < 4) goto LAB_0015e159;
        zip_entry->atime = (ulong)*(uint *)(p + uVar7);
        uVar7 = uVar7 + 4;
        uVar8 = uVar8 - 4;
      }
      if (((bVar1 & 4) != 0) && (3 < (ushort)uVar8)) {
        zip_entry->ctime = (ulong)*(uint *)(p + uVar7);
        uVar7 = uVar7 + 4;
        uVar8 = uVar8 - 4;
      }
    }
    else if (sVar4 == 0x5855) {
      if (7 < uVar3) {
        zip_entry->atime = (ulong)*(uint *)(p + uVar6);
        zip_entry->mtime = (ulong)*(uint *)(p + uVar6 + 4);
        if (0xb < uVar3) {
          zip_entry->uid = (ulong)*(ushort *)(p + uVar6 + 8);
          uVar6 = (ulong)*(ushort *)(p + uVar6 + 10);
          goto LAB_0015e058;
        }
      }
    }
    else if (sVar4 == 0x6c65) {
      iVar9 = 0;
      if (uVar3 == 0) goto LAB_0015e156;
      bVar1 = p[uVar6];
      bVar2 = bVar1;
      for (; (0x7f < bVar2 && ((ushort)(uVar3 - 1) != (short)iVar9)); iVar9 = iVar9 + 1) {
        bVar2 = p[iVar5 + iVar9 + 5];
      }
      iVar11 = (uint)uVar3 - iVar9;
      uVar8 = iVar11 + 0xffff;
      uVar7 = iVar5 + iVar9 + 5;
      if ((bVar1 & 1) != 0) {
        if ((ushort)iVar11 < 3) goto LAB_0015e159;
        zip_entry->system = p[(ulong)uVar7 + 1];
        uVar7 = iVar5 + iVar9 + 7;
        uVar8 = iVar11 - 3;
      }
      if ((bVar1 & 2) != 0) {
        if ((ushort)uVar8 < 2) goto LAB_0015e159;
        uVar7 = uVar7 + 2;
        uVar8 = uVar8 - 2;
      }
      if ((bVar1 & 4) != 0) {
        if ((ushort)uVar8 < 4) goto LAB_0015e159;
        if (zip_entry->system == '\x03') {
          zip_entry->mode = *(uint16_t *)(p + (ulong)uVar7 + 2);
        }
        uVar7 = uVar7 + 4;
        uVar8 = uVar8 - 4;
      }
      if (((bVar1 & 8) != 0) && (1 < (ushort)uVar8)) {
        uVar3 = *(ushort *)(p + uVar7);
        uVar7 = uVar7 + 2;
        uVar8 = uVar8 - 2;
        if (uVar3 <= (ushort)uVar8) {
          uVar7 = uVar7 + uVar3;
          uVar8 = uVar8 - uVar3;
        }
      }
    }
    else if (sVar4 == 0x7855) {
      if ((1 < uVar3) && (zip_entry->uid = (ulong)*(ushort *)(p + uVar6), 3 < uVar3)) {
        uVar6 = (ulong)*(ushort *)(p + uVar6 + 2);
        goto LAB_0015e058;
      }
    }
    else if (sVar4 == 1) {
      zip_entry->flags = zip_entry->flags | 1;
      if (zip_entry->uncompressed_size == 0xffffffff) {
        if (uVar3 < 8) goto LAB_0015e159;
        zip_entry->uncompressed_size = *(int64_t *)(p + uVar6);
        uVar7 = iVar5 + 0xc;
        uVar8 = uVar3 - 8;
      }
      if (zip_entry->compressed_size == 0xffffffff) {
        if ((ushort)uVar8 < 8) goto LAB_0015e159;
        zip_entry->compressed_size = *(int64_t *)(p + uVar7);
        uVar7 = uVar7 + 8;
        uVar8 = uVar8 - 8;
      }
      if ((7 < (ushort)uVar8) && (zip_entry->local_header_offset == 0xffffffff)) {
        zip_entry->local_header_offset = *(int64_t *)(p + uVar7);
        uVar7 = uVar7 + 8;
        uVar8 = uVar8 - 8;
      }
    }
LAB_0015e159:
    uVar6 = (ulong)((uVar8 & 0xffff) + uVar7);
  } while( true );
}

Assistant:

static void
process_extra(const char *p, size_t extra_length, struct zip_entry* zip_entry)
{
	unsigned offset = 0;

	while (offset < extra_length - 4)
	{
		unsigned short headerid = archive_le16dec(p + offset);
		unsigned short datasize = archive_le16dec(p + offset + 2);
		offset += 4;
		if (offset + datasize > extra_length)
			break;
#ifdef DEBUG
		fprintf(stderr, "Header id 0x%x, length %d\n",
		    headerid, datasize);
#endif
		switch (headerid) {
		case 0x0001:
			/* Zip64 extended information extra field. */
			zip_entry->flags |= LA_USED_ZIP64;
			if (zip_entry->uncompressed_size == 0xffffffff) {
				if (datasize < 8)
					break;
				zip_entry->uncompressed_size =
				    archive_le64dec(p + offset);
				offset += 8;
				datasize -= 8;
			}
			if (zip_entry->compressed_size == 0xffffffff) {
				if (datasize < 8)
					break;
				zip_entry->compressed_size =
				    archive_le64dec(p + offset);
				offset += 8;
				datasize -= 8;
			}
			if (zip_entry->local_header_offset == 0xffffffff) {
				if (datasize < 8)
					break;
				zip_entry->local_header_offset =
				    archive_le64dec(p + offset);
				offset += 8;
				datasize -= 8;
			}
			/* archive_le32dec(p + offset) gives disk
			 * on which file starts, but we don't handle
			 * multi-volume Zip files. */
			break;
		case 0x5455:
		{
			/* Extended time field "UT". */
			int flags = p[offset];
			offset++;
			datasize--;
			/* Flag bits indicate which dates are present. */
			if (flags & 0x01)
			{
#ifdef DEBUG
				fprintf(stderr, "mtime: %lld -> %d\n",
				    (long long)zip_entry->mtime,
				    archive_le32dec(p + offset));
#endif
				if (datasize < 4)
					break;
				zip_entry->mtime = archive_le32dec(p + offset);
				offset += 4;
				datasize -= 4;
			}
			if (flags & 0x02)
			{
				if (datasize < 4)
					break;
				zip_entry->atime = archive_le32dec(p + offset);
				offset += 4;
				datasize -= 4;
			}
			if (flags & 0x04)
			{
				if (datasize < 4)
					break;
				zip_entry->ctime = archive_le32dec(p + offset);
				offset += 4;
				datasize -= 4;
			}
			break;
		}
		case 0x5855:
		{
			/* Info-ZIP Unix Extra Field (old version) "UX". */
			if (datasize >= 8) {
				zip_entry->atime = archive_le32dec(p + offset);
				zip_entry->mtime =
				    archive_le32dec(p + offset + 4);
			}
			if (datasize >= 12) {
				zip_entry->uid =
				    archive_le16dec(p + offset + 8);
				zip_entry->gid =
				    archive_le16dec(p + offset + 10);
			}
			break;
		}
		case 0x6c65:
		{
			/* Experimental 'el' field */
			/*
			 * Introduced Dec 2013 to provide a way to
			 * include external file attributes in local file
			 * header.  This provides file type and permission
			 * information necessary to support full streaming
			 * extraction.  Currently being discussed with
			 * other Zip developers... subject to change.
			 */
			int bitmap, bitmap_last;

			if (datasize < 1)
				break;
			bitmap_last = bitmap = 0xff & p[offset];
			offset += 1;
			datasize -= 1;

			/* We only support first 7 bits of bitmap; skip rest. */
			while ((bitmap_last & 0x80) != 0
			    && datasize >= 1) {
				bitmap_last = p[offset];
				offset += 1;
				datasize -= 1;
			}

			if (bitmap & 1) {
				// 2 byte "version made by"
				if (datasize < 2)
					break;
				zip_entry->system
				    = archive_le16dec(p + offset) >> 8;
				offset += 2;
				datasize -= 2;
			}
			if (bitmap & 2) {
				// 2 byte "internal file attributes"
				uint32_t internal_attributes;
				if (datasize < 2)
					break;
				internal_attributes
				    = archive_le16dec(p + offset);
				// Not used by libarchive at present.
				(void)internal_attributes; /* UNUSED */
				offset += 2;
				datasize -= 2;
			}
			if (bitmap & 4) {
				// 4 byte "external file attributes"
				uint32_t external_attributes;
				if (datasize < 4)
					break;
				external_attributes
				    = archive_le32dec(p + offset);
				if (zip_entry->system == 3) {
					zip_entry->mode
					    = external_attributes >> 16;
				}
				offset += 4;
				datasize -= 4;
			}
			if (bitmap & 8) {
				// 2 byte comment length + comment
				uint32_t comment_length;
				if (datasize < 2)
					break;
				comment_length
				    = archive_le16dec(p + offset);
				offset += 2;
				datasize -= 2;

				if (datasize < comment_length)
					break;
				// Comment is not supported by libarchive
				offset += comment_length;
				datasize -= comment_length;
			}
			break;
		}
		case 0x7855:
			/* Info-ZIP Unix Extra Field (type 2) "Ux". */
#ifdef DEBUG
			fprintf(stderr, "uid %d gid %d\n",
			    archive_le16dec(p + offset),
			    archive_le16dec(p + offset + 2));
#endif
			if (datasize >= 2)
				zip_entry->uid = archive_le16dec(p + offset);
			if (datasize >= 4)
				zip_entry->gid =
				    archive_le16dec(p + offset + 2);
			break;
		case 0x7875:
		{
			/* Info-Zip Unix Extra Field (type 3) "ux". */
			int uidsize = 0, gidsize = 0;

			/* TODO: support arbitrary uidsize/gidsize. */
			if (datasize >= 1 && p[offset] == 1) {/* version=1 */
				if (datasize >= 4) {
					/* get a uid size. */
					uidsize = p[offset+1];
					if (uidsize == 2)
						zip_entry->uid =
						    archive_le16dec(
						        p + offset + 2);
					else if (uidsize == 4 && datasize >= 6)
						zip_entry->uid =
						    archive_le32dec(
						        p + offset + 2);
				}
				if (datasize >= (2 + uidsize + 3)) {
					/* get a gid size. */
					gidsize = p[offset+2+uidsize];
					if (gidsize == 2)
						zip_entry->gid =
						    archive_le16dec(
						        p+offset+2+uidsize+1);
					else if (gidsize == 4 &&
					    datasize >= (2 + uidsize + 5))
						zip_entry->gid =
						    archive_le32dec(
						        p+offset+2+uidsize+1);
				}
			}
			break;
		}
		default:
			break;
		}
		offset += datasize;
	}
#ifdef DEBUG
	if (offset != extra_length)
	{
		fprintf(stderr,
		    "Extra data field contents do not match reported size!\n");
	}
#endif
}